

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_cast.cpp
# Opt level: O2

string_t duckdb::StringCastTZ::Operation<duckdb::timestamp_t>(timestamp_t input,Vector *vector)

{
  undefined **ppuVar1;
  idx_t iVar2;
  idx_t length;
  idx_t len;
  char *data;
  anon_union_16_2_67f50693_for_value aVar3;
  bool add_bc;
  int32_t date [3];
  int32_t time [4];
  date_t date_entry;
  char micro_buffer [6];
  idx_t year_length;
  dtime_t time_entry;
  bool local_85;
  int32_t local_84;
  int32_t local_80;
  int32_t local_7c;
  int32_t local_78;
  int32_t local_74;
  int32_t local_70;
  int32_t local_6c [4];
  date_t local_5c;
  char local_58 [8];
  idx_t local_50;
  dtime_t local_48;
  anon_union_16_2_67f50693_for_value local_40;
  
  if (input.value == -0x7fffffffffffffff) {
    ppuVar1 = &Date::NINF;
  }
  else {
    if (input.value != 0x7fffffffffffffff) {
      Timestamp::Convert(input,&local_5c,&local_48);
      Date::Convert(local_5c,&local_84,&local_80,&local_7c);
      Time::Convert(local_48,&local_78,&local_74,&local_70,local_6c);
      local_58[4] = '\0';
      local_58[5] = '\0';
      local_58[0] = '\0';
      local_58[1] = '\0';
      local_58[2] = '\0';
      local_58[3] = '\0';
      iVar2 = DateToStringCast::YearLength(&local_84,&local_50,&local_85);
      length = TimeToStringCast::MicrosLength(local_6c[0],local_58);
      local_40.pointer =
           (anon_struct_16_3_d7536bce_for_pointer)
           StringVector::EmptyString((StringVector *)vector,(Vector *)(length + iVar2 + 4),len);
      data = local_40._8_8_;
      if (local_40._0_4_ < 0xd) {
        data = local_40.pointer.prefix;
      }
      DateToStringCast::Format(data,&local_84,local_50,local_85);
      data[iVar2] = ' ';
      TimeToStringCast::Format(data + iVar2 + 1,length,&local_78,local_58);
      (data + length + iVar2 + 1)[0] = '+';
      (data + length + iVar2 + 1)[1] = '0';
      data[length + iVar2 + 3] = '0';
      string_t::Finalize((string_t *)&local_40.pointer);
      return (string_t)local_40.pointer;
    }
    ppuVar1 = (undefined **)&Date::PINF;
  }
  aVar3.pointer = (anon_struct_16_3_d7536bce_for_pointer)StringVector::AddString(vector,*ppuVar1);
  return (anon_union_16_2_67f50693_for_value)(anon_union_16_2_67f50693_for_value)aVar3.pointer;
}

Assistant:

string_t StringCastTZ::Operation(timestamp_t input, Vector &vector) {
	if (input == timestamp_t::infinity()) {
		return StringVector::AddString(vector, Date::PINF);
	}
	if (input == timestamp_t::ninfinity()) {
		return StringVector::AddString(vector, Date::NINF);
	}

	date_t date_entry;
	dtime_t time_entry;
	Timestamp::Convert(input, date_entry, time_entry);

	int32_t date[3], time[4];
	Date::Convert(date_entry, date[0], date[1], date[2]);
	Time::Convert(time_entry, time[0], time[1], time[2], time[3]);

	// format for timestamptz is DATE TIME+00 (separated by space)
	idx_t year_length;
	bool add_bc;
	char micro_buffer[6] = {};
	const idx_t date_length = DateToStringCast::Length(date, year_length, add_bc);
	const idx_t time_length = TimeToStringCast::Length(time, micro_buffer);
	const idx_t length = date_length + 1 + time_length + 3;

	string_t result = StringVector::EmptyString(vector, length);
	auto data = result.GetDataWriteable();

	idx_t pos = 0;
	DateToStringCast::Format(data + pos, date, year_length, add_bc);
	pos += date_length;
	data[pos++] = ' ';
	TimeToStringCast::Format(data + pos, time_length, time, micro_buffer);
	pos += time_length;
	data[pos++] = '+';
	data[pos++] = '0';
	data[pos++] = '0';

	result.Finalize();
	return result;
}